

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_halfrate(OggVorbis_File *vf,int flag)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  bVar1 = false;
  do {
    bVar2 = bVar1;
    if (vf->vi == (vorbis_info *)0x0) {
      iVar3 = -0x83;
      goto LAB_0018fad0;
    }
    if (3 < vf->ready_state) {
      vorbis_dsp_clear(&vf->vd);
      vorbis_block_clear(&vf->vb);
      vf->ready_state = 3;
      lVar4 = vf->pcm_offset;
      if (-1 < lVar4) {
        vf->pcm_offset = -1;
        ov_pcm_seek(vf,lVar4);
      }
    }
    lVar4 = 0;
    lVar5 = -1;
    do {
      lVar5 = lVar5 + 1;
      if (vf->links <= lVar5) {
        iVar3 = 0;
        goto LAB_0018fad0;
      }
      iVar3 = vorbis_synthesis_halfrate((vorbis_info *)((long)&vf->vi->version + lVar4),flag);
      lVar4 = lVar4 + 0x38;
    } while (iVar3 == 0);
    bVar6 = flag != 0;
    flag = 0;
    bVar1 = true;
  } while (bVar6);
  iVar3 = -0x83;
LAB_0018fad0:
  if (bVar2) {
    iVar3 = -0x83;
  }
  return iVar3;
}

Assistant:

int ov_halfrate(OggVorbis_File *vf,int flag){
  int i;
  if(vf->vi==NULL)return OV_EINVAL;
  if(vf->ready_state>STREAMSET){
    /* clear out stream state; dumping the decode machine is needed to
       reinit the MDCT lookups. */
    vorbis_dsp_clear(&vf->vd);
    vorbis_block_clear(&vf->vb);
    vf->ready_state=STREAMSET;
    if(vf->pcm_offset>=0){
      ogg_int64_t pos=vf->pcm_offset;
      vf->pcm_offset=-1; /* make sure the pos is dumped if unseekable */
      ov_pcm_seek(vf,pos);
    }
  }

  for(i=0;i<vf->links;i++){
    if(vorbis_synthesis_halfrate(vf->vi+i,flag)){
      if(flag) ov_halfrate(vf,0);
      return OV_EINVAL;
    }
  }
  return 0;
}